

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void __thiscall SystemError::SystemError(SystemError *this,int type)

{
  int type_local;
  SystemError *this_local;
  
  ENerror::ENerror(&this->super_ENerror);
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__SystemError_0019ea98;
  if ((-1 < type) && (type < 0xc)) {
    (this->super_ENerror).code = SystemErrorCodes[type];
    std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,SystemErrorMsgs[type]);
  }
  return;
}

Assistant:

SystemError::SystemError(int type)
{
    if ( type >= 0 && type < SYSTEM_ERROR_LIMIT )
    {
        code = SystemErrorCodes[type];
        msg =  SystemErrorMsgs[type];
    }
}